

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  bool bVar1;
  int iVar2;
  UnitTestImpl *this_00;
  UnitTest *this_01;
  TestEventListeners *this_02;
  TestEventListener *pTVar3;
  OsStackTraceGetterInterface *pOVar4;
  TimeInMillis TVar5;
  TestInfo *pTVar6;
  TestResult *this_03;
  int local_38;
  int local_34;
  int j;
  int i;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestSuite *this_local;
  
  if ((this->should_run_ & 1U) == 0) {
    return;
  }
  this_00 = internal::GetUnitTestImpl();
  internal::UnitTestImpl::set_current_test_suite(this_00,this);
  this_01 = UnitTest::GetInstance();
  this_02 = UnitTest::listeners(this_01);
  pTVar3 = TestEventListeners::repeater(this_02);
  (*pTVar3->_vptr_TestEventListener[6])(pTVar3,this);
  (*pTVar3->_vptr_TestEventListener[7])(pTVar3,this);
  pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
  (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x2d3ac0,(char *)0x0);
  TVar5 = internal::GetTimeInMillis();
  this->start_timestamp_ = TVar5;
  for (local_34 = 0; iVar2 = total_test_count(this), local_34 < iVar2; local_34 = local_34 + 1) {
    pTVar6 = GetMutableTestInfo(this,local_34);
    TestInfo::Run(pTVar6);
    if ((FLAGS_gtest_fail_fast & 1) != 0) {
      pTVar6 = GetMutableTestInfo(this,local_34);
      this_03 = TestInfo::result(pTVar6);
      bVar1 = TestResult::Failed(this_03);
      local_38 = local_34;
      if (bVar1) goto LAB_002b56ab;
    }
  }
LAB_002b56f4:
  TVar5 = internal::GetTimeInMillis();
  this->elapsed_time_ = TVar5 - this->start_timestamp_;
  pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
  (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x2d3b10,(char *)0x0);
  (*pTVar3->_vptr_TestEventListener[0xb])(pTVar3,this);
  (*pTVar3->_vptr_TestEventListener[0xc])(pTVar3,this);
  internal::UnitTestImpl::set_current_test_suite(this_00,(TestSuite *)0x0);
  return;
LAB_002b56ab:
  while( true ) {
    local_38 = local_38 + 1;
    iVar2 = total_test_count(this);
    if (iVar2 <= local_38) break;
    pTVar6 = GetMutableTestInfo(this,local_38);
    TestInfo::Skip(pTVar6);
  }
  goto LAB_002b56f4;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  start_timestamp_ = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
    if (GTEST_FLAG(fail_fast) && GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = internal::GetTimeInMillis() - start_timestamp_;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}